

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

void duckdb::FSSTStorage::StringScanPartial<true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  optional_ptr<duckdb::FileBuffer,_true> *this;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  data_ptr_t pdVar4;
  BlockManager *pBVar5;
  long lVar6;
  FSSTScanState *scan_state;
  DBConfig *pDVar7;
  BlockHandle *pBVar8;
  idx_t iVar9;
  idx_t iVar10;
  VectorStringBuffer *str_buffer;
  long lVar11;
  ulong uVar12;
  data_ptr_t pdVar13;
  idx_t iVar14;
  long lVar15;
  data_ptr_t dict_end;
  data_ptr_t pdVar16;
  anon_union_16_2_67f50693_for_value aVar17;
  bp_delta_offsets_t offsets;
  undefined1 local_b0 [8];
  data_ptr_t pdStack_a8;
  idx_t local_a0;
  ColumnSegment *local_98;
  idx_t local_90;
  buffer_ptr<void> *local_88;
  data_ptr_t local_80;
  ulong local_78;
  idx_t local_70;
  bp_delta_offsets_t local_68;
  
  local_70 = result_offset;
  scan_state = (FSSTScanState *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  local_90 = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  pDVar7 = DBConfig::GetConfig(segment->db);
  bVar1 = (pDVar7->options).enable_fsst_vectors;
  this = &(scan_state->super_StringScanState).handle.node;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  pdVar4 = ((scan_state->super_StringScanState).handle.node.ptr)->buffer;
  iVar14 = segment->offset;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this);
  if (scan_count != 0) {
    local_78 = (ulong)*(uint *)(((scan_state->super_StringScanState).handle.node.ptr)->buffer +
                               segment->offset + 4);
    pdVar13 = pdVar4 + iVar14 + 0x10;
    local_a0 = scan_count;
    local_98 = segment;
    if ((bVar1 != false) &&
       ((scan_state->duckdb_fsst_decoder).internal.
        super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)) {
      local_88 = &scan_state->duckdb_fsst_decoder;
      local_80 = pdVar13;
      Vector::SetVectorType(result,FSST_VECTOR);
      pBVar8 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&local_98->block);
      pBVar5 = pBVar8->block_manager;
      iVar9 = optional_idx::GetIndex(&pBVar5->block_alloc_size);
      iVar10 = optional_idx::GetIndex(&pBVar5->block_header_size);
      iVar9 = iVar9 - iVar10 >> 2 & 0xfffffffffffffff8;
      if (0xfff < iVar9) {
        iVar9 = 0x1000;
      }
      FSSTVector::RegisterDecoder(result,local_88,iVar9);
      pdVar13 = local_80;
    }
    iVar9 = local_a0;
    pdVar16 = result->data;
    StartScan(&local_68,scan_state,pdVar13,local_90,local_a0);
    lVar6 = local_78 + iVar14;
    if (bVar1 == false) {
      str_buffer = StringVector::GetStringBuffer(result);
      lVar15 = iVar9 + (iVar9 == 0);
      pdVar16 = pdVar16 + local_70 * 0x10 + 8;
      iVar14 = local_68.unused_delta_decoded_values;
      iVar9 = local_68.scan_offset;
      do {
        uVar12 = (ulong)(scan_state->bitunpack_buffer).
                        super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                        .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[iVar9];
        lVar11 = (long)(int)(scan_state->delta_decode_buffer).
                            super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                            _M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                            .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[iVar14];
        pdVar13 = pdVar4 + (lVar6 - lVar11);
        if (lVar11 == 0) {
          pdVar13 = (data_ptr_t)0x0;
        }
        if (uVar12 == 0) {
          uVar12 = 0;
          aVar17 = (anon_union_16_2_67f50693_for_value)ZEXT816(0);
        }
        else {
          if (scan_state->all_values_inlined == true) {
            aVar17.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 FSSTPrimitives::DecompressInlinedValue
                           (scan_state->duckdb_fsst_decoder_ptr,(char *)pdVar13,uVar12);
          }
          else {
            aVar17.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 FSSTPrimitives::DecompressValue
                           (scan_state->duckdb_fsst_decoder_ptr,str_buffer,(char *)pdVar13,uVar12);
          }
          uVar12 = aVar17._0_8_ & 0xffffffff00000000;
        }
        *(ulong *)(pdVar16 + -8) = aVar17.pointer.length | uVar12;
        *(char **)pdVar16 = aVar17.pointer.ptr;
        iVar9 = iVar9 + 1;
        iVar14 = iVar14 + 1;
        pdVar16 = pdVar16 + 0x10;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    else {
      lVar15 = iVar9 + (iVar9 == 0);
      pdVar16 = pdVar16 + 8;
      iVar14 = local_68.unused_delta_decoded_values;
      iVar9 = local_68.scan_offset;
      do {
        uVar2 = (scan_state->delta_decode_buffer).
                super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[iVar14];
        if ((long)(int)uVar2 < 0) {
          _local_b0 = (anon_struct_16_3_d7536bce_for_pointer)
                      UncompressedStringStorage::ReadOverflowString
                                (local_98,result,*(block_id_t *)(pdVar4 + (lVar6 - (ulong)-uVar2)),
                                 (int32_t)*(block_id_t *)
                                           ((long)(pdVar4 + (lVar6 - (ulong)-uVar2)) + 8));
        }
        else {
          uVar3 = (scan_state->bitunpack_buffer).
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[iVar9];
          pdVar13 = pdVar4 + (lVar6 - (int)uVar2);
          if (uVar3 < 0xd) {
            _local_b0 = (anon_union_16_2_67f50693_for_value)ZEXT416(uVar3);
            if (uVar3 != 0) {
              switchD_015ff80e::default(local_b0 + 4,pdVar13,(ulong)uVar3);
            }
          }
          else {
            local_b0._4_4_ = *(undefined4 *)pdVar13;
            local_b0._0_4_ = uVar3;
            pdStack_a8 = pdVar13;
          }
        }
        *(undefined4 *)(pdVar16 + -8) = local_b0._0_4_;
        *(undefined4 *)(pdVar16 + -4) = local_b0._4_4_;
        *(data_ptr_t *)pdVar16 = pdStack_a8;
        FSSTVector::SetCount(result,local_a0);
        pdVar16 = pdVar16 + 0x10;
        iVar9 = iVar9 + 1;
        iVar14 = iVar14 + 1;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    scan_state->last_known_index =
         (scan_state->delta_decode_buffer).
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
         [local_68.unused_delta_decoded_values + local_a0 + 0xffffffffffffffff];
    scan_state->last_known_row = local_a0 + local_90 + -1;
  }
  return;
}

Assistant:

void FSSTStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                                    idx_t result_offset) {

	auto &scan_state = state.scan_state->Cast<FSSTScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	bool enable_fsst_vectors;
	if (ALLOW_FSST_VECTORS) {
		auto &config = DBConfig::GetConfig(segment.db);
		enable_fsst_vectors = config.options.enable_fsst_vectors;
	} else {
		enable_fsst_vectors = false;
	}

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict = GetDictionary(segment, scan_state.handle);
	auto base_data = data_ptr_cast(baseptr + sizeof(fsst_compression_header_t));
	string_t *result_data;

	if (scan_count == 0) {
		return;
	}

	if (enable_fsst_vectors) {
		D_ASSERT(result_offset == 0);
		if (scan_state.duckdb_fsst_decoder) {
			D_ASSERT(result_offset == 0 || result.GetVectorType() == VectorType::FSST_VECTOR);
			result.SetVectorType(VectorType::FSST_VECTOR);
			auto string_block_limit = StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize());
			FSSTVector::RegisterDecoder(result, scan_state.duckdb_fsst_decoder, string_block_limit);
			result_data = FSSTVector::GetCompressedData<string_t>(result);
		} else {
			D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
			result_data = FlatVector::GetData<string_t>(result);
		}
	} else {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		result_data = FlatVector::GetData<string_t>(result);
	}

	auto offsets = StartScan(scan_state, base_data, start, scan_count);
	auto &bitunpack_buffer = scan_state.bitunpack_buffer;
	auto &delta_decode_buffer = scan_state.delta_decode_buffer;
	if (enable_fsst_vectors) {
		// Lookup decompressed offsets in dict
		for (idx_t i = 0; i < scan_count; i++) {
			uint32_t string_length = bitunpack_buffer[i + offsets.scan_offset];
			result_data[i] = UncompressedStringStorage::FetchStringFromDict(
			    segment, dict.end, result, baseptr,
			    UnsafeNumericCast<int32_t>(delta_decode_buffer[i + offsets.unused_delta_decoded_values]),
			    string_length);
			FSSTVector::SetCount(result, scan_count);
		}
	} else {
		// Just decompress
		auto &str_buffer = StringVector::GetStringBuffer(result);
		for (idx_t i = 0; i < scan_count; i++) {
			result_data[i + result_offset] = scan_state.DecompressString(dict, baseptr, offsets, i, str_buffer);
		}
	}
	EndScan(scan_state, offsets, start, scan_count);
}